

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall TasGrid::GridGlobal::loadNeededValues(GridGlobal *this,double *vals)

{
  clearGpuValues(this);
  if (((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    StorageSet::setValues(&(this->super_BaseCanonicalGrid).values,vals);
  }
  else {
    StorageSet::addValues
              (&(this->super_BaseCanonicalGrid).values,&(this->super_BaseCanonicalGrid).points,
               &(this->super_BaseCanonicalGrid).needed,vals);
  }
  acceptUpdatedTensors(this);
  return;
}

Assistant:

void GridGlobal::loadNeededValues(const double *vals){
    clearGpuValues();
    if (points.empty() || needed.empty()){
        values.setValues(vals);
    }else{
        values.addValues(points, needed, vals);
    }
    acceptUpdatedTensors();
}